

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O2

void __thiscall QMessageBox::changeEvent(QMessageBox *this,QEvent *ev)

{
  long lVar1;
  QDialogButtonBox *this_00;
  TextInteractionFlags flags;
  int iVar2;
  QStyle *pQVar3;
  
  if (*(short *)(ev + 8) == 100) {
    lVar1 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
    if (*(Icon *)(lVar1 + 0x2e8) != NoIcon) {
      setIcon(this,*(Icon *)(lVar1 + 0x2e8));
    }
    pQVar3 = QWidget::style((QWidget *)this);
    flags.super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
    super_QFlagsStorage<Qt::TextInteractionFlag>.i =
         (QFlagsStorageHelper<Qt::TextInteractionFlag,_4>)
         (**(code **)(*(long *)pQVar3 + 0xf0))(pQVar3,0x46,0,this,0);
    QLabel::setTextInteractionFlags(*(QLabel **)(lVar1 + 0x2e0),flags);
    this_00 = *(QDialogButtonBox **)(lVar1 + 0x2f8);
    pQVar3 = QWidget::style((QWidget *)this);
    iVar2 = (**(code **)(*(long *)pQVar3 + 0xf0))(pQVar3,0x48,0,this,0);
    QDialogButtonBox::setCenterButtons(this_00,iVar2 != 0);
    if (*(QLabel **)(lVar1 + 0x358) != (QLabel *)0x0) {
      QLabel::setTextInteractionFlags(*(QLabel **)(lVar1 + 0x358),flags);
    }
  }
  QWidget::changeEvent((QWidget *)this,ev);
  return;
}

Assistant:

void QMessageBox::changeEvent(QEvent *ev)
{
    Q_D(QMessageBox);
    switch (ev->type()) {
    case QEvent::StyleChange:
    {
        if (d->icon != NoIcon)
            setIcon(d->icon);
        Qt::TextInteractionFlags flags(style()->styleHint(QStyle::SH_MessageBox_TextInteractionFlags, nullptr, this));
        d->label->setTextInteractionFlags(flags);
        d->buttonBox->setCenterButtons(style()->styleHint(QStyle::SH_MessageBox_CenterButtons, nullptr, this));
        if (d->informativeLabel)
            d->informativeLabel->setTextInteractionFlags(flags);
        Q_FALLTHROUGH();
    }
    case QEvent::FontChange:
    case QEvent::ApplicationFontChange:
#ifdef Q_OS_MAC
    {
        QFont f = font();
        f.setBold(true);
        d->label->setFont(f);
    }
#endif
        Q_FALLTHROUGH();
    default:
        break;
    }
    QDialog::changeEvent(ev);
}